

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_PrintfError_Test::TestBody(PrintfTest_PrintfError_Test *this)

{
  type_conflict5 tVar1;
  char *message;
  file read_end;
  file write_end;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  AssertHelper local_18;
  int result;
  
  read_end.fd_ = -1;
  write_end.fd_ = -1;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  fmt::v5::file::fdopen((file *)&gtest_ar,(int)&read_end,"r");
  tVar1 = fmt::v5::fprintf<char[5]>
                    ((FILE *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),(char (*) [5])0x19f64d);
  fmt::v5::buffered_file::~buffered_file((buffered_file *)&gtest_ar);
  local_30.ptr_._0_4_ = 0;
  result = tVar1;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)&gtest_ar,"result","0",&result,(int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ef,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return;
}

Assistant:

TEST(PrintfTest, PrintfError) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  int result = fmt::fprintf(read_end.fdopen("r").get(), "test");
  EXPECT_LT(result, 0);
}